

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O1

lu_byte luaH_getshortstr(Table *t,TString *key,TValue *res)

{
  int *piVar1;
  TValue *io2;
  TValue *pTVar2;
  
  pTVar2 = (TValue *)(t->node + (~(-1 << (t->lsizenode & 0x1f)) & key->hash));
  do {
    if ((((NodeKey *)pTVar2)->key_tt == 'D') &&
       ((TString *)(((NodeKey *)pTVar2)->key_val).gc == key)) goto LAB_0011af41;
    piVar1 = &((NodeKey *)pTVar2)->next;
    pTVar2 = (TValue *)((long)pTVar2 + (long)*piVar1 * 0x18);
  } while ((long)*piVar1 != 0);
  pTVar2 = &absentkey;
LAB_0011af41:
  if ((((NodeKey *)pTVar2)->tt_ & 0xf) != 0) {
    res->value_ = ((NodeKey *)pTVar2)->value_;
    res->tt_ = ((NodeKey *)pTVar2)->tt_;
  }
  return ((NodeKey *)pTVar2)->tt_ & 0x3f;
}

Assistant:

const TValue *luaH_Hgetshortstr (Table *t, TString *key) {
  Node *n = hashstr(t, key);
  lua_assert(strisshr(key));
  for (;;) {  /* check whether 'key' is somewhere in the chain */
    if (keyisshrstr(n) && eqshrstr(keystrval(n), key))
      return gval(n);  /* that's it */
    else {
      int nx = gnext(n);
      if (nx == 0)
        return &absentkey;  /* not found */
      n += nx;
    }
  }
}